

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  int iVar1;
  secp256k1_fe x;
  secp256k1_fe x_1;
  secp256k1_ge Q;
  unsigned_long _zzq_result;
  secp256k1_fe local_158;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_ge local_c8;
  secp256k1_fe local_60;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_parse_cold_3();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input == (uchar *)0x0) {
      secp256k1_ec_pubkey_parse_cold_1();
      return 0;
    }
    if (inputlen == 0x41) {
      if (7 < *input) {
        return 0;
      }
      if ((0xd0U >> (*input & 0x1f) & 1) == 0) {
        return 0;
      }
      secp256k1_fe_impl_set_b32_mod(&local_f8,input + 1);
      iVar1 = 0;
      if (((local_f8.n[0] < 0xffffefffffc2f) || (local_f8.n[4] != 0xffffffffffff)) ||
         ((local_f8.n[2] & local_f8.n[3] & local_f8.n[1]) != 0xfffffffffffff)) {
        local_f8.magnitude = 1;
        local_f8.normalized = 1;
        secp256k1_fe_verify(&local_f8);
        secp256k1_fe_impl_set_b32_mod(&local_128,input + 0x21);
        if (((local_128.n[0] < 0xffffefffffc2f) || (local_128.n[4] != 0xffffffffffff)) ||
           ((local_128.n[2] & local_128.n[3] & local_128.n[1]) != 0xfffffffffffff)) {
          local_128.magnitude = 1;
          local_128.normalized = 1;
          secp256k1_fe_verify(&local_128);
          secp256k1_ge_set_xy(&local_c8,&local_f8,&local_128);
          if (((*input & 0xfe) != 6) ||
             (secp256k1_fe_verify(&local_128), (*input != '\a') != (bool)((byte)local_128.n[0] & 1))
             ) {
            secp256k1_ge_verify(&local_c8);
            iVar1 = 0;
            if (local_c8.infinity == 0) {
              secp256k1_fe_sqr(&local_158,&local_c8.y);
              secp256k1_fe_sqr(&local_60,&local_c8.x);
              secp256k1_fe_mul(&local_60,&local_60,&local_c8.x);
              secp256k1_fe_verify(&local_60);
              local_60.n[0] = local_60.n[0] + 2;
              local_60.magnitude = local_60.magnitude + 1;
              local_60.normalized = 0;
              secp256k1_fe_verify(&local_60);
              iVar1 = secp256k1_fe_equal(&local_158,&local_60);
            }
          }
        }
      }
    }
    else {
      if (inputlen != 0x21) {
        return 0;
      }
      if ((*input & 0xfe) != 2) {
        return 0;
      }
      secp256k1_fe_impl_set_b32_mod(&local_158,input + 1);
      if (((local_158.n[0] < 0xffffefffffc2f) || (local_158.n[4] != 0xffffffffffff)) ||
         (iVar1 = 0, (local_158.n[2] & local_158.n[3] & local_158.n[1]) != 0xfffffffffffff)) {
        local_158.magnitude = 1;
        local_158.normalized = 1;
        secp256k1_fe_verify(&local_158);
        iVar1 = secp256k1_ge_set_xo_var(&local_c8,&local_158,(uint)(*input == '\x03'));
      }
    }
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = secp256k1_ge_is_in_correct_subgroup(&local_c8);
    if (iVar1 != 0) {
      secp256k1_pubkey_save(pubkey,&local_c8);
      return 1;
    }
    return 0;
  }
  secp256k1_ec_pubkey_parse_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}